

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLin>>
               (ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLin>
                *renderer,ImDrawList *DrawList,ImRect *cull_rect)

{
  bool bVar1;
  uint uVar2;
  int prim;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ImVec2 uv;
  ImVec2 local_48;
  uint local_3c;
  ulong local_38;
  
  uVar6 = renderer->Prims;
  local_48 = DrawList->_Data->TexUvWhitePixel;
  if (uVar6 == 0) {
    uVar7 = 0;
  }
  else {
    prim = 0;
    uVar7 = 0;
    do {
      uVar3 = 0xffff - DrawList->_VtxCurrentIdx;
      uVar5 = uVar3 / 5;
      if (uVar6 < uVar5) {
        uVar5 = uVar6;
      }
      uVar4 = (ulong)uVar5;
      uVar2 = 0x40;
      if (uVar6 < 0x40) {
        uVar2 = uVar6;
      }
      if (uVar3 / 5 < uVar2) {
        if (uVar7 != 0) {
          ImDrawList::PrimUnreserve(DrawList,uVar7 * 6,uVar7 * 5);
        }
        uVar4 = 0x3333;
        if (uVar6 < 0x3333) {
          uVar4 = (ulong)uVar6;
        }
        ImDrawList::PrimReserve(DrawList,(int)uVar4 * 6,(int)uVar4 * 5);
        uVar3 = 0;
      }
      else {
        uVar3 = uVar7 - uVar5;
        if (uVar7 < uVar5) {
          ImDrawList::PrimReserve(DrawList,(uVar5 - uVar7) * 6,(uVar5 - uVar7) * 5);
          uVar3 = 0;
        }
      }
      uVar5 = (uint)uVar4;
      local_38 = uVar4;
      local_3c = uVar6;
      uVar7 = uVar3;
      while (uVar5 != 0) {
        bVar1 = ShadedRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::GetterXsYRef<long_long>,_ImPlot::TransformerLogLin>
                ::operator()(renderer,DrawList,cull_rect,&local_48,prim);
        uVar7 = uVar7 + !bVar1;
        prim = prim + 1;
        uVar5 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar5;
      }
      uVar6 = local_3c - (int)local_38;
    } while (uVar6 != 0);
  }
  if (uVar7 != 0) {
    ImDrawList::PrimUnreserve(DrawList,uVar7 * 6,uVar7 * 5);
  }
  return;
}

Assistant:

inline void RenderPrimitives(const Renderer& renderer, ImDrawList& DrawList, const ImRect& cull_rect) {
    unsigned int prims        = renderer.Prims;
    unsigned int prims_culled = 0;
    unsigned int idx          = 0;
    const ImVec2 uv = DrawList._Data->TexUvWhitePixel;
    while (prims) {
        // find how many can be reserved up to end of current draw command's limit
        unsigned int cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - DrawList._VtxCurrentIdx) / Renderer::VtxConsumed);
        // make sure at least this many elements can be rendered to avoid situations where at the end of buffer this slow path is not taken all the time
        if (cnt >= ImMin(64u, prims)) {
            if (prims_culled >= cnt)
                prims_culled -= cnt; // reuse previous reservation
            else {
                DrawList.PrimReserve((cnt - prims_culled) * Renderer::IdxConsumed, (cnt - prims_culled) * Renderer::VtxConsumed); // add more elements to previous reservation
                prims_culled = 0;
            }
        }
        else
        {
            if (prims_culled > 0) {
                DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
                prims_culled = 0;
            }
            cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - 0/*DrawList._VtxCurrentIdx*/) / Renderer::VtxConsumed);
            DrawList.PrimReserve(cnt * Renderer::IdxConsumed, cnt * Renderer::VtxConsumed); // reserve new draw command
        }
        prims -= cnt;
        for (unsigned int ie = idx + cnt; idx != ie; ++idx) {
            if (!renderer(DrawList, cull_rect, uv, idx))
                prims_culled++;
        }
    }
    if (prims_culled > 0)
        DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
}